

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

bool __thiscall google::protobuf::MapKey::operator<(MapKey *this,MapKey *other)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [13];
  LogMessage local_58;
  MapKey *local_20;
  MapKey *other_local;
  MapKey *this_local;
  
  local_20 = other;
  other_local = this;
  if (this->type_ != other->type_) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x1a2);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"Unsupported: type mismatch");
    internal::LogFinisher::operator=(local_65,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  }
  CVar1 = type(this);
  switch(CVar1) {
  case CPPTYPE_INT32:
    this_local._7_1_ = (this->val_).int32_value_ < (local_20->val_).int32_value_;
    break;
  case CPPTYPE_INT64:
    this_local._7_1_ = (this->val_).int64_value_ < (local_20->val_).int64_value_;
    break;
  case CPPTYPE_UINT32:
    this_local._7_1_ = (this->val_).uint32_value_ < (local_20->val_).uint32_value_;
    break;
  case CPPTYPE_UINT64:
    this_local._7_1_ = (this->val_).string_value_ < (local_20->val_).string_value_;
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x1a9);
    pLVar2 = internal::LogMessage::operator<<(&local_a0,"Unsupported");
    internal::LogFinisher::operator=(&local_a1,pLVar2);
    internal::LogMessage::~LogMessage(&local_a0);
    this_local._7_1_ = false;
    break;
  case CPPTYPE_BOOL:
    this_local._7_1_ = ((this->val_).bool_value_ & 1U) < ((local_20->val_).bool_value_ & 1U);
    break;
  case CPPTYPE_STRING:
    this_local._7_1_ = std::operator<((this->val_).string_value_,(local_20->val_).string_value_);
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator<(const MapKey& other) const {
    if (type_ != other.type_) {
      // We could define a total order that handles this case, but
      // there currently no need.  So, for now, fail.
      GOOGLE_LOG(FATAL) << "Unsupported: type mismatch";
    }
    switch (type()) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        return false;
      case FieldDescriptor::CPPTYPE_STRING:
        return *val_.string_value_ < *other.val_.string_value_;
      case FieldDescriptor::CPPTYPE_INT64:
        return val_.int64_value_ < other.val_.int64_value_;
      case FieldDescriptor::CPPTYPE_INT32:
        return val_.int32_value_ < other.val_.int32_value_;
      case FieldDescriptor::CPPTYPE_UINT64:
        return val_.uint64_value_ < other.val_.uint64_value_;
      case FieldDescriptor::CPPTYPE_UINT32:
        return val_.uint32_value_ < other.val_.uint32_value_;
      case FieldDescriptor::CPPTYPE_BOOL:
        return val_.bool_value_ < other.val_.bool_value_;
    }
    return false;
  }